

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase399::run(TestCase399 *this)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *ptrCopy;
  uint destroyed3;
  uint destroyed2;
  uint destroyed1;
  uint counter;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> combined;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> arr;
  uint local_a8;
  uint local_a4;
  uint local_a0 [2];
  undefined8 *local_98;
  undefined8 uStack_90;
  undefined8 *local_88;
  undefined8 *local_78;
  undefined8 uStack_70;
  undefined8 *local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 *local_40;
  
  local_a0[1] = 0;
  local_a0[0] = 0;
  local_a4 = 0;
  local_a8 = 0;
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = (long)(local_a0 + 1);
  plVar1[1] = (long)local_a0;
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)(local_a0 + 1);
  plVar2[1] = (long)&local_a4;
  plVar3 = (long *)operator_new(0x10);
  *plVar3 = (long)(local_a0 + 1);
  plVar3[1] = (long)&local_a8;
  puVar4 = (undefined8 *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_40 = &_::HeapArrayDisposer::instance;
  *puVar4 = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar4[1] = plVar1;
  uStack_70 = 1;
  local_68 = &_::HeapArrayDisposer::instance;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_78 = puVar4;
  puVar5 = (undefined8 *)operator_new(0x40);
  puVar5[1] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar5[2] = plVar3;
  puVar5[3] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar5[4] = plVar2;
  puVar5[5] = puVar4;
  puVar5[6] = 1;
  puVar5[7] = &_::HeapArrayDisposer::instance;
  local_78 = (undefined8 *)0x0;
  uStack_70 = 0;
  *puVar5 = &PTR_disposeImpl_001b7d50;
  uStack_90 = 1;
  local_98 = puVar4;
  local_88 = puVar5;
  if (_::Debug::minSeverity < 3 && local_a0[0] != 0) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a5,ERROR,"\"failed: expected \" \"destroyed1 == 0\"",
               (char (*) [33])"failed: expected destroyed1 == 0");
  }
  if (_::Debug::minSeverity < 3 && local_a4 != 0) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a6,ERROR,"\"failed: expected \" \"destroyed2 == 0\"",
               (char (*) [33])"failed: expected destroyed2 == 0");
  }
  if ((local_a8 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a7,ERROR,"\"failed: expected \" \"destroyed3 == 0\"",
               (char (*) [33])"failed: expected destroyed3 == 0");
  }
  local_98 = (undefined8 *)0x0;
  uStack_90 = 0;
  (**(code **)*puVar5)
            (puVar5,puVar4,0x10,1,1,
             ArrayDisposer::
             Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>,_false>::destruct
            );
  if (_::Debug::minSeverity < 3 && local_a0[0] != 1) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ab,ERROR,"\"failed: expected \" \"destroyed1 == 1\", destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",local_a0);
  }
  if (_::Debug::minSeverity < 3 && local_a4 != 2) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ac,ERROR,"\"failed: expected \" \"destroyed2 == 2\", destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",&local_a4);
  }
  if ((local_a8 != 3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ad,ERROR,"\"failed: expected \" \"destroyed3 == 3\", destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",&local_a8);
  }
  return;
}

Assistant:

TEST(Array, Attach) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto builder = kj::heapArrayBuilder<Own<DestructionOrderRecorder>>(1);
  builder.add(kj::mv(obj1));
  auto arr = builder.finish();
  auto ptr = arr.begin();

  Array<Own<DestructionOrderRecorder>> combined = arr.attach(kj::mv(obj2), kj::mv(obj3));

  KJ_EXPECT(combined.begin() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}